

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::CheckAllocExternalMark(Recycler *this)

{
  CollectionState CVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContextId pvVar5;
  
  if (this->disableThreadAccessCheck == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82c,"(!disableThreadAccessCheck)","!disableThreadAccessCheck");
    if (!bVar3) goto LAB_0070c839;
    *puVar4 = 0;
  }
  pvVar5 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar5 != this->mainThreadId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82d,"(GetCurrentThreadContextId() == mainThreadId)",
                       "GetCurrentThreadContextId() == mainThreadId");
    if (!bVar3) goto LAB_0070c839;
    *puVar4 = 0;
  }
  CVar1 = (this->collectionState).value;
  if ((CVar1 != CollectionStateConcurrentMark & (byte)CVar1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x832,
                       "(this->IsMarkState() && collectionState != CollectionStateConcurrentMark)",
                       "this->IsMarkState() && collectionState != CollectionStateConcurrentMark");
    if (!bVar3) {
LAB_0070c839:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
Recycler::CheckAllocExternalMark() const
{
    Assert(!disableThreadAccessCheck);
    Assert(GetCurrentThreadContextId() == mainThreadId);
#if ENABLE_CONCURRENT_GC
  #ifdef HEAP_ENUMERATION_VALIDATION
    Assert((this->IsMarkState() || this->IsPostEnumHeapValidationInProgress()) && collectionState != CollectionStateConcurrentMark);
  #else
    Assert(this->IsMarkState()  && collectionState != CollectionStateConcurrentMark);
  #endif
#else
    Assert(this->IsMarkState());
#endif
}